

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O3

void __thiscall
CServerBrowserFilter::Sort
          (CServerBrowserFilter *this,CServerEntry **ppServerlist,int NumServers,int ResortFlags)

{
  CServerFilter *this_00;
  uint uVar1;
  CServerFilter *pCVar2;
  CConfig *pCVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  this->m_ppServerlist = ppServerlist;
  this->m_NumServers = NumServers;
  iVar4 = (this->m_lFilters).num_elements;
  if (0 < iVar4) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      pCVar2 = (this->m_lFilters).list;
      this_00 = (CServerFilter *)((long)((pCVar2->m_FilterInfo).m_aGametype + -2) + 8 + lVar6);
      if (((ResortFlags & 1U) != 0) ||
         (((uVar1 = *(uint *)((long)&((CServerFilterInfo *)((pCVar2->m_FilterInfo).m_aGametype + -1)
                                     )->m_SortHash + lVar6), (ResortFlags & 2U) != 0 &&
           ((uVar1 & 0x400) != 0)) ||
          (pCVar3 = this_00->m_pServerBrowserFilter->m_pConfig,
          uVar1 != (uVar1 & 0x7ff0 | (pCVar3->m_BrSort & 7U) + pCVar3->m_BrSortOrder * 8))))) {
        CServerFilter::Sort(this_00);
        iVar4 = (this->m_lFilters).num_elements;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0xe8;
    } while (lVar5 < iVar4);
  }
  return;
}

Assistant:

void CServerBrowserFilter::Sort(CServerEntry **ppServerlist, int NumServers, int ResortFlags)
{
	m_ppServerlist = ppServerlist;
	m_NumServers = NumServers;
	for(int i = 0; i < m_lFilters.size(); i++)
	{
		// check if we need to resort
		CServerFilter *pFilter = &m_lFilters[i];
		if((ResortFlags&RESORT_FLAG_FORCE) || ((ResortFlags&RESORT_FLAG_FAV) && pFilter->m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FAVORITE) || pFilter->m_FilterInfo.m_SortHash != pFilter->GetSortHash())
			pFilter->Sort();
	}
}